

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilityTests.cpp
# Opt level: O2

void __thiscall UtilityTest_PtrConst_Test::TestBody(UtilityTest_PtrConst_Test *this)

{
  ulong uVar1;
  pointer pdVar2;
  char *pcVar3;
  pointer pdVar4;
  AssertHelper AStack_88;
  AssertionResult gtest_ar_1;
  AssertHelper local_70;
  vector<char,_std::allocator<char>_> emptyVector;
  vector<double,_std::allocator<double>_> vDouble;
  
  emptyVector.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3ff4cccccccccccd;
  std::vector<double,_std::allocator<double>_>::vector
            (&vDouble,5,(value_type *)&emptyVector,(allocator_type *)&gtest_ar_1);
  pdVar4 = (pointer)0x0;
  pdVar2 = vDouble.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (vDouble.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      vDouble.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    pdVar2 = pdVar4;
  }
  uVar1 = 0;
  do {
    if ((ulong)((long)vDouble.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)vDouble.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= uVar1) {
      emptyVector.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      emptyVector.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      emptyVector.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      testing::internal::EqHelper<true>::Compare<char_const>
                ((EqHelper<true> *)&gtest_ar_1,"__null","ptr(emptyVector)",(Secret *)0x0,(char *)0x0
                );
      if (gtest_ar_1.success_ == false) {
        testing::Message::Message((Message *)&AStack_88);
        if (gtest_ar_1.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/utility/UtilityTests.cpp"
                   ,0x21,pcVar3);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&AStack_88);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&AStack_88);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_1.message_);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&emptyVector.super__Vector_base<char,_std::allocator<char>_>);
LAB_001aa55f:
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&vDouble.super__Vector_base<double,_std::allocator<double>_>);
      return;
    }
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&emptyVector,"vDouble[i]","ptrDouble[i]",
               (double *)
               ((long)vDouble.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + (long)pdVar4),
               (double *)((long)pdVar2 + (long)pdVar4));
    if ((char)emptyVector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&gtest_ar_1);
      if (emptyVector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish == (pointer)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)emptyVector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_88,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/utility/UtilityTests.cpp"
                 ,0x1f,pcVar3);
      testing::internal::AssertHelper::operator=(&AStack_88,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper(&AStack_88);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&emptyVector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish);
      goto LAB_001aa55f;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&emptyVector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish);
    uVar1 = uVar1 + 1;
    pdVar4 = pdVar4 + 1;
  } while( true );
}

Assistant:

TEST(UtilityTest, PtrConst) {
    const vector<double> vDouble(5, 1.3);
    const double* ptrDouble = ptr(vDouble);
    for (int i = 0; i < vDouble.size(); i++)
        ASSERT_EQ(vDouble[i], ptrDouble[i]);
    const vector<char> emptyVector;
    ASSERT_EQ(NULL, ptr(emptyVector));
}